

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

CordBuffer __thiscall
absl::lts_20250127::Cord::GetAppendBufferSlowPath
          (Cord *this,size_t block_size,size_t capacity,size_t min_capacity)

{
  uint8_t uVar1;
  ulong *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  CordzInfo *this_00;
  CordRepFlat *pCVar6;
  uint8_t *puVar7;
  CordzInfo *extraout_RAX;
  byte bVar8;
  sbyte sVar9;
  byte bVar10;
  ulong uVar11;
  sbyte sVar12;
  int iVar13;
  uint uVar14;
  uint8_t *puVar15;
  uint8_t *extraout_RDX;
  CordRep *unaff_RBP;
  ulong uVar16;
  int iVar17;
  size_t len;
  CordRep *in_R8;
  Cord *pCVar18;
  ExtractResult EVar19;
  CordBuffer CVar20;
  CordzUpdateScope scope;
  CordzUpdateScope local_38;
  CordRepBtree *tree;
  
  bVar10 = *(byte *)block_size;
  pCVar18 = (Cord *)(long)(char)bVar10;
  tree = *(CordRepBtree **)(block_size + 8);
  if (tree == (CordRepBtree *)0x0 || ((ulong)pCVar18 & 1) == 0) {
    if ((bVar10 & 1) != 0) {
      GetAppendBufferSlowPath();
      this_00 = extraout_RAX;
      in_R8 = unaff_RBP;
LAB_0031b95c:
      cord_internal::CordzInfo::Lock(this_00,kGetAppendBuffer);
      goto LAB_0031b60e;
    }
    uVar16 = (ulong)pCVar18 >> 1;
    len = 0xffffffffffffffff;
    if (!CARRY8(min_capacity,uVar16)) {
      len = min_capacity + uVar16;
    }
    if (capacity == 0) {
      if (0xf < len) {
        pCVar6 = cord_internal::CordRepFlat::NewImpl<4096ul>(len);
        goto LAB_0031b812;
      }
      (this->contents_).data_.rep_.field_0.data[0] = '\x01';
      *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1) = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      pCVar6 = (CordRepFlat *)(this->contents_).data_.rep_.field_0.as_tree.cordz_info;
      uVar11 = 1;
    }
    else {
      if ((capacity ^ capacity - 1) <= capacity - 1) goto LAB_0031b9a6;
      uVar11 = 0x10000;
      if (len < 0x10000) {
        uVar11 = len;
      }
      uVar5 = 0x10000;
      if (capacity < 0x10000) {
        uVar5 = capacity;
      }
      if (((uVar11 + 0xd < uVar5) && (uVar5 = uVar11 + 0xd, 0xff3 < len)) &&
         (uVar5 = len, (uVar11 & uVar11 - 1) != 0)) {
        uVar5 = uVar11 - 1;
        if (uVar5 == 0) {
          bVar8 = 0;
        }
        else {
          lVar3 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          bVar8 = (byte)lVar3 ^ 0x3f;
        }
        uVar5 = 1L << (-bVar8 & 0x3f);
        if (0x80 < (uVar5 - uVar11) - 0xd) {
          lVar3 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar5 = 1L << ((byte)lVar3 & 0x3f);
        }
      }
      pCVar6 = cord_internal::CordRepFlat::NewImpl<262144ul>(uVar5 - 0xd);
LAB_0031b812:
      (pCVar6->super_CordRep).length = 0;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)pCVar6;
      uVar11 = (ulong)pCVar6 & 0xffffffff;
    }
    puVar15 = (uint8_t *)((this->contents_).data_.rep_.field_0.data + 1);
    puVar7 = (pCVar6->super_CordRep).storage;
    if ((uVar11 & 1) != 0) {
      puVar7 = puVar15;
    }
    if (bVar10 < 0xf) {
      if (bVar10 < 7) {
        if (bVar10 != 0) {
          *puVar7 = *(uint8_t *)(block_size + 1);
          uVar1 = *(uint8_t *)(block_size + 1 + ((ulong)pCVar18 >> 2));
          puVar15 = (uint8_t *)CONCAT71((int7)((ulong)puVar15 >> 8),uVar1);
          puVar7[(ulong)pCVar18 >> 2] = uVar1;
          puVar7[uVar16 - 1] = *(uint8_t *)(block_size + uVar16);
        }
      }
      else {
        uVar14 = *(uint *)((block_size - 3) + uVar16);
        puVar15 = (uint8_t *)(ulong)uVar14;
        *(undefined4 *)puVar7 = *(undefined4 *)(block_size + 1);
        *(uint *)(puVar7 + (uVar16 - 4)) = uVar14;
      }
    }
    else {
      if (0x1f < bVar10) {
        __assert_fail("n <= 15",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x62,
                      "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                     );
      }
      puVar15 = *(uint8_t **)((block_size - 7) + uVar16);
      *(undefined8 *)puVar7 = *(undefined8 *)(block_size + 1);
      *(uint8_t **)(puVar7 + (uVar16 - 8)) = puVar15;
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      (this->contents_).data_.rep_.field_0.data[0] = bVar10 | 1;
LAB_0031b8ee:
      *(undefined8 *)block_size = 0;
      *(undefined8 *)(block_size + 8) = 0;
      goto LAB_0031b948;
    }
    puVar2 = (ulong *)(this->contents_).data_.rep_.field_0.as_tree.cordz_info;
    bVar10 = *(byte *)((long)puVar2 + 0xc);
    sVar12 = 0xc;
    if (bVar10 < 0xbb) {
      sVar12 = 6;
    }
    iVar17 = -0xb800d;
    if (bVar10 < 0xbb) {
      iVar17 = -0xe8d;
    }
    sVar9 = 3;
    if (0x42 < bVar10) {
      sVar9 = sVar12;
    }
    iVar13 = -0x1d;
    if (0x42 < bVar10) {
      iVar13 = iVar17;
    }
    uVar14 = ((uint)bVar10 << sVar9) + iVar13;
    puVar15 = (uint8_t *)(ulong)uVar14;
    if (uVar16 <= (ulong)(long)(int)uVar14) {
      *puVar2 = uVar16;
      goto LAB_0031b8ee;
    }
    GetAppendBufferSlowPath();
    this = pCVar18;
LAB_0031b973:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = tree;
    EVar19 = (ExtractResult)(auVar4 << 0x40);
LAB_0031b975:
    tree = (CordRepBtree *)EVar19.extracted;
    Mutex::AssertHeld(&((CordzInfo *)block_size)->mutex_);
    ((CordzInfo *)block_size)->rep_ = EVar19.tree;
LAB_0031b7b1:
    bVar10 = (tree->super_CordRep).tag;
    if ((bVar10 - 0xf9 < 7) || (bVar10 < 6)) {
LAB_0031b987:
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
    }
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)tree;
  }
  else {
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)block_size);
    local_38.info_ = this_00;
    if (this_00 != (CordzInfo *)0x0) goto LAB_0031b95c;
LAB_0031b60e:
    EVar19.extracted = &tree->super_CordRep;
    EVar19.tree = in_R8;
    bVar10 = (tree->super_CordRep).tag;
    if (bVar10 == 3) {
      EVar19 = cord_internal::CordRepBtree::ExtractAppendBuffer(tree,(size_t)in_R8);
      tree = (CordRepBtree *)EVar19.extracted;
      if (tree != (CordRepBtree *)0x0) {
        if ((*(byte *)block_size & 1) == 0) {
LAB_0031b9e4:
          __assert_fail("data_.is_tree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x4fe,
                        "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                       );
        }
        if (EVar19.tree == (CordRep *)0x0) {
LAB_0031b79c:
          tree = (CordRepBtree *)EVar19.extracted;
          *(undefined8 *)block_size = 0;
          *(undefined8 *)(block_size + 8) = 0;
          block_size = (size_t)local_38.info_;
          if (local_38.info_ != (CordzInfo *)0x0) goto LAB_0031b973;
        }
        else {
          *(CordRep **)(block_size + 8) = EVar19.tree;
          block_size = (size_t)local_38.info_;
          if (local_38.info_ != (CordzInfo *)0x0) goto LAB_0031b975;
        }
        goto LAB_0031b7b1;
      }
    }
    else if ((5 < bVar10) &&
            ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2)) {
      bVar10 = (tree->super_CordRep).tag;
      if ((bVar10 - 0xf9 < 7) || (bVar10 < 6)) goto LAB_0031b987;
      sVar12 = 0xc;
      if (bVar10 < 0xbb) {
        sVar12 = 6;
      }
      iVar17 = -0xb800d;
      if (bVar10 < 0xbb) {
        iVar17 = -0xe8d;
      }
      sVar9 = 3;
      if (0x42 < bVar10) {
        sVar9 = sVar12;
      }
      iVar13 = -0x1d;
      if (0x42 < bVar10) {
        iVar13 = iVar17;
      }
      if (in_R8 <= (CordRep *)
                   ((long)(int)(((uint)bVar10 << sVar9) + iVar13) - (tree->super_CordRep).length)) {
        if ((*(byte *)block_size & 1) == 0) goto LAB_0031b9e4;
        goto LAB_0031b79c;
      }
    }
    if (capacity == 0) {
      if (min_capacity < 0x10) {
        (this->contents_).data_.rep_.field_0.data[0] = '\x01';
        *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1) = 0;
        (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
        goto LAB_0031b93b;
      }
      pCVar6 = cord_internal::CordRepFlat::NewImpl<4096ul>(min_capacity);
    }
    else {
      if ((capacity ^ capacity - 1) <= capacity - 1) {
LAB_0031b9a6:
        __assert_fail("IsPow2(block_size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord_buffer.h"
                      ,0x1dd,
                      "static CordBuffer absl::CordBuffer::CreateWithCustomLimitImpl(size_t, size_t, AllocationHints...) [AllocationHints = <>]"
                     );
      }
      uVar16 = 0x10000;
      if (min_capacity < 0x10000) {
        uVar16 = min_capacity;
      }
      uVar11 = 0x10000;
      if (capacity < 0x10000) {
        uVar11 = capacity;
      }
      if (((uVar16 + 0xd < uVar11) && (uVar11 = uVar16 + 0xd, 0xff3 < min_capacity)) &&
         (uVar11 = min_capacity, (uVar16 & uVar16 - 1) != 0)) {
        uVar11 = uVar16 - 1;
        if (uVar11 == 0) {
          bVar10 = 0;
        }
        else {
          lVar3 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          bVar10 = (byte)lVar3 ^ 0x3f;
        }
        uVar11 = 1L << (-bVar10 & 0x3f);
        if (0x80 < (uVar11 - uVar16) - 0xd) {
          lVar3 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar11 = 1L << ((byte)lVar3 & 0x3f);
        }
      }
      pCVar6 = cord_internal::CordRepFlat::NewImpl<262144ul>(uVar11 - 0xd);
    }
    (pCVar6->super_CordRep).length = 0;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)pCVar6;
  }
LAB_0031b93b:
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
  puVar15 = extraout_RDX;
LAB_0031b948:
  CVar20.rep_.field_0.long_rep.padding = puVar15;
  CVar20.rep_.field_0.long_rep.rep = (CordRepFlat *)this;
  return (CordBuffer)CVar20.rep_.field_0;
}

Assistant:

CordBuffer Cord::GetAppendBufferSlowPath(size_t block_size, size_t capacity,
                                         size_t min_capacity) {
  auto constexpr method = CordzUpdateTracker::kGetAppendBuffer;
  CordRep* tree = contents_.tree();
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    CordRep::ExtractResult result = ExtractAppendBuffer(tree, min_capacity);
    if (result.extracted != nullptr) {
      contents_.SetTreeOrEmpty(result.tree, scope);
      return CordBuffer(result.extracted->flat());
    }
    return block_size ? CordBuffer::CreateWithCustomLimit(block_size, capacity)
                      : CordBuffer::CreateWithDefaultLimit(capacity);
  }
  return CreateAppendBuffer(contents_.data_, block_size, capacity);
}